

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int __thiscall MovDemuxer::ParseTableEntry(MovDemuxer *this,MOVAtom atom)

{
  int iVar1;
  MovDemuxer *this_local;
  
  if (atom.type == 0x34366f63) {
    iVar1 = mov_read_stco(this,atom);
    return iVar1;
  }
  if (((atom.type == 0x43637661) || (atom.type == 0x43637668)) || (atom.type == 0x4363766d)) {
LAB_003034d3:
    iVar1 = mov_read_glbl(this,atom);
    return iVar1;
  }
  if ((atom.type != 0x6169646d) && (atom.type != 0x61746475)) {
    if (atom.type == 0x63616c61) {
LAB_0030341d:
      iVar1 = mov_read_extradata(this,atom);
      return iVar1;
    }
    if (atom.type == 0x63737473) {
      iVar1 = mov_read_stsc(this,atom);
      return iVar1;
    }
    if (atom.type == 0x6468646d) {
      iVar1 = mov_read_mdhd(this,atom);
      return iVar1;
    }
    if (atom.type == 0x64686674) {
      iVar1 = mov_read_tfhd(this,atom);
      return iVar1;
    }
    if (atom.type == 0x64686b74) {
      iVar1 = mov_read_tkhd(this,atom);
      return iVar1;
    }
    if (atom.type == 0x6468766d) {
      iVar1 = mov_read_mvhd(this,atom);
      return iVar1;
    }
    if (atom.type == 0x64737473) {
      iVar1 = mov_read_stsd(this,atom);
      return iVar1;
    }
    if (atom.type == 0x65646977) {
      iVar1 = mov_read_wide(this,atom);
      return iVar1;
    }
    if (atom.type == 0x65766177) {
      iVar1 = mov_read_wave(this,atom);
      return iVar1;
    }
    if (atom.type != 0x66617274) {
      if (atom.type == 0x66657264) {
        iVar1 = mov_read_dref(this,atom);
        return iVar1;
      }
      if ((atom.type != 0x666e6964) && (atom.type != 0x666e696d)) {
        if (atom.type == 0x666f6f6d) {
          iVar1 = mov_read_moof(this,atom);
          return iVar1;
        }
        if (atom.type == 0x6832706a) goto LAB_0030341d;
        if (atom.type == 0x6b617274) {
          iVar1 = mov_read_trak(this,atom);
          return iVar1;
        }
        if (atom.type == 0x6c626c67) goto LAB_003034d3;
        if (atom.type != 0x6c627473) {
          if (atom.type == 0x6c656966) goto LAB_0030341d;
          if (atom.type == 0x6e6b7274) {
            iVar1 = mov_read_trkn(this,atom);
            return iVar1;
          }
          if (atom.type == 0x6e757274) {
            iVar1 = mov_read_trun(this,atom);
            return iVar1;
          }
          if (atom.type == 0x6f637473) {
            iVar1 = mov_read_stco(this,atom);
            return iVar1;
          }
          if (atom.type == 0x70797466) {
            iVar1 = mov_read_ftyp(this,atom);
            return iVar1;
          }
          if (atom.type == 0x726c6468) {
            iVar1 = mov_read_hdlr(this,atom);
            return iVar1;
          }
          if (atom.type == 0x73647365) {
            iVar1 = mov_read_esds(this,atom);
            return iVar1;
          }
          if (atom.type == 0x73737473) {
            iVar1 = mov_read_stss(this,atom);
            return iVar1;
          }
          if (atom.type == 0x73737661) {
            iVar1 = mov_read_extradata(this,atom);
            return iVar1;
          }
          if (atom.type != 0x73746465) {
            if (atom.type == 0x73747463) {
              iVar1 = mov_read_ctts(this,atom);
              return iVar1;
            }
            if (atom.type == 0x73747473) {
              iVar1 = mov_read_stts(this,atom);
              return iVar1;
            }
            if (atom.type == 0x7461646d) {
              iVar1 = mov_read_mdat(this,atom);
              return iVar1;
            }
            if (atom.type == 0x74736c65) {
              iVar1 = mov_read_elst(this,atom);
              return iVar1;
            }
            if (atom.type == 0x766f6d63) {
              iVar1 = mov_read_cmov(this,atom);
              return iVar1;
            }
            if (atom.type == 0x766f6f6d) {
              iVar1 = mov_read_moov(this,atom);
              return iVar1;
            }
            if (atom.type == 0x78657274) {
              iVar1 = mov_read_trex(this,atom);
              return iVar1;
            }
            if (atom.type != 0x7865766d) {
              if (atom.type == 0x7a737473) {
                iVar1 = mov_read_stsz(this,atom);
                return iVar1;
              }
              if ((atom.type & 0xff) == 0xa9) {
                iVar1 = mov_read_udta_string(this,atom);
                return iVar1;
              }
              return 0;
            }
          }
        }
      }
    }
  }
  iVar1 = mov_read_default(this,atom);
  return iVar1;
}

Assistant:

int MovDemuxer::ParseTableEntry(MOVAtom atom)
{
    switch (atom.type)
    {
    case MKTAG('a', 'v', 's', 's'):
        return mov_read_extradata(atom);
    case MKTAG('c', 'm', 'o', 'v'):
        return mov_read_cmov(atom);
    case MKTAG('c', 'o', '6', '4'):
        return mov_read_stco(atom);
    case MKTAG('c', 't', 't', 's'):
        return mov_read_ctts(atom);
    case MKTAG('d', 'i', 'n', 'f'):
    case MKTAG('e', 'd', 't', 's'):
    case MKTAG('m', 'd', 'i', 'a'):
    case MKTAG('m', 'i', 'n', 'f'):
    case MKTAG('m', 'v', 'e', 'x'):
    case MKTAG('s', 't', 'b', 'l'):
    case MKTAG('t', 'r', 'a', 'f'):
    case MKTAG('u', 'd', 't', 'a'):
        return mov_read_default(atom);
    case MKTAG('d', 'r', 'e', 'f'):
        return mov_read_dref(atom);
    case MKTAG('e', 'l', 's', 't'):
        return mov_read_elst(atom);
    case MKTAG('e', 's', 'd', 's'):
        return mov_read_esds(atom);
    case MKTAG('a', 'l', 'a', 'c'):
    case MKTAG('f', 'i', 'e', 'l'):
    case MKTAG('j', 'p', '2', 'h'):
        return mov_read_extradata(atom);
    case MKTAG('f', 't', 'y', 'p'):
        return mov_read_ftyp(atom);
    case MKTAG('a', 'v', 'c', 'C'):
    case MKTAG('g', 'l', 'b', 'l'):
    case MKTAG('m', 'v', 'c', 'C'):
    case MKTAG('h', 'v', 'c', 'C'):
        return mov_read_glbl(atom);
    case MKTAG('h', 'd', 'l', 'r'):
        return mov_read_hdlr(atom);
    case MKTAG('m', 'd', 'a', 't'):
        return mov_read_mdat(atom);
    case MKTAG('m', 'd', 'h', 'd'):
        return mov_read_mdhd(atom);
    case MKTAG('m', 'o', 'o', 'f'):
        return mov_read_moof(atom);
    case MKTAG('m', 'o', 'o', 'v'):
        return mov_read_moov(atom);
    case MKTAG('m', 'v', 'h', 'd'):
        return mov_read_mvhd(atom);
    case MKTAG('s', 't', 'c', 'o'):
        return mov_read_stco(atom);
    case MKTAG('s', 't', 's', 'c'):
        return mov_read_stsc(atom);
    case MKTAG('s', 't', 's', 'd'):
        return mov_read_stsd(atom);
    case MKTAG('s', 't', 's', 's'):
        return mov_read_stss(atom);
    case MKTAG('s', 't', 's', 'z'):
        return mov_read_stsz(atom);
    case MKTAG('s', 't', 't', 's'):
        return mov_read_stts(atom);
    case MKTAG('t', 'k', 'h', 'd'):
        return mov_read_tkhd(atom);
    case MKTAG('t', 'f', 'h', 'd'):
        return mov_read_tfhd(atom);
    case MKTAG('t', 'r', 'a', 'k'):
        return mov_read_trak(atom);
    case MKTAG('t', 'r', 'e', 'x'):
        return mov_read_trex(atom);
    case MKTAG('t', 'r', 'k', 'n'):
        return mov_read_trkn(atom);
    case MKTAG('t', 'r', 'u', 'n'):
        return mov_read_trun(atom);
    case MKTAG('w', 'a', 'v', 'e'):
        return mov_read_wave(atom);
    case MKTAG('w', 'i', 'd', 'e'):
        return mov_read_wide(atom);
    default:
        break;
    }

    // Apple QuickTime tags
    if ((atom.type & 0xff) == 0xa9)
        return mov_read_udta_string(atom);

    return 0;
}